

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void line_attempt_1(int x0,int y0,int x1,int y1,TGAImage *image,TGAColor color)

{
  int y;
  int x;
  float t;
  TGAImage *image_local;
  int y1_local;
  int x1_local;
  int y0_local;
  int x0_local;
  TGAColor color_local;
  
  register0x00000000 = color.bgra;
  x0_local._3_1_ = color.bytespp;
  for (y = 0; (float)y < 1.0; y = (int)((float)y + 0.01)) {
    TGAImage::set(image,(long)(int)((float)(x1 - x0) * (float)y + (float)x0),
                  (long)(int)((float)(y1 - y0) * (float)y + (float)y0),
                  (TGAColor *)((long)&y0_local + 3));
  }
  return;
}

Assistant:

void line_attempt_1(int x0, int y0, int x1, int y1, TGAImage &image, TGAColor color)
{
    for (float t = 0.f; t < 1.f; t += .01f) {
        int x = static_cast<int>(static_cast<float>(x0) + static_cast<float>(x1 - x0) * t);
        int y = static_cast<int>(static_cast<float>(y0) + static_cast<float>(y1 - y0) * t);
        image.set(x, y, color);
    }
}